

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O0

bool S_GetSoundPlayingInfo(sector_t *sec,int sound_id)

{
  int iVar1;
  FSoundChan *local_28;
  FSoundChan *chan;
  int sound_id_local;
  sector_t *sec_local;
  
  if (0 < sound_id) {
    for (local_28 = Channels; local_28 != (FSoundChan *)0x0; local_28 = local_28->NextChan) {
      iVar1 = FSoundID::operator_cast_to_int(&local_28->OrgID);
      if (((iVar1 == sound_id) && (local_28->SourceType == '\x02')) &&
         ((local_28->field_12).Actor == (AActor *)sec)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool S_GetSoundPlayingInfo (const sector_t *sec, int sound_id)
{
	if (sound_id > 0)
	{
		for (FSoundChan *chan = Channels; chan != NULL; chan = chan->NextChan)
		{
			if (chan->OrgID == sound_id &&
				chan->SourceType == SOURCE_Sector &&
				chan->Sector == sec)
			{
				return true;
			}
		}
	}
	return false;
}